

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_lockpick(tgestate_t *state)

{
  doorindex_t *pdVar1;
  tgestate_t *in_RDI;
  doorindex_t *pdoor;
  tgestate_t *in_stack_00000018;
  
  pdVar1 = get_nearest_door(in_stack_00000018);
  if (pdVar1 != (doorindex_t *)0x0) {
    in_RDI->ptr_to_door_being_lockpicked = pdVar1;
    in_RDI->player_locked_out_until = in_RDI->game_counter + 0xff;
    in_RDI->vischars[0].flags = '\x01';
    queue_message(in_RDI,message_PICKING_THE_LOCK);
  }
  return;
}

Assistant:

void action_lockpick(tgestate_t *state)
{
  doorindex_t *pdoor; /* was HL */

  assert(state != NULL);

  pdoor = get_nearest_door(state);
  if (pdoor == NULL)
    return; /* No door nearby. */

  state->ptr_to_door_being_lockpicked = pdoor;
  state->player_locked_out_until = state->game_counter + 255;
  state->vischars[0].flags = vischar_FLAGS_PICKING_LOCK;
  queue_message(state, message_PICKING_THE_LOCK);
}